

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::SliderCalcRatioFromValueT<float,float>
                (ImGuiDataType data_type,float v,float v_min,float v_max,float power,
                float linear_zero_pos)

{
  float fVar1;
  float fVar2;
  float local_3c;
  bool local_36;
  float f_1;
  float f;
  float v_clamped;
  bool is_power;
  float linear_zero_pos_local;
  float power_local;
  float v_max_local;
  float v_min_local;
  float v_local;
  ImGuiDataType data_type_local;
  
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    local_36 = false;
    if ((power != 1.0) || (NAN(power))) {
      local_36 = data_type == 8 || data_type == 9;
    }
    if (v_max <= v_min) {
      local_3c = ImClamp<float>(v,v_max,v_min);
    }
    else {
      local_3c = ImClamp<float>(v,v_min,v_max);
    }
    if (local_36) {
      if (0.0 <= local_3c) {
        fVar1 = ImMax<float>(0.0,v_min);
        fVar2 = ImMax<float>(0.0,v_min);
        fVar1 = ImPow((local_3c - fVar1) / (v_max - fVar2),1.0 / power);
        v_local = fVar1 * (1.0 - linear_zero_pos) + linear_zero_pos;
      }
      else {
        fVar1 = ImMin<float>(0.0,v_max);
        fVar1 = ImPow(1.0 - (local_3c - v_min) / (fVar1 - v_min),1.0 / power);
        v_local = (1.0 - fVar1) * linear_zero_pos;
      }
    }
    else {
      v_local = (local_3c - v_min) / (v_max - v_min);
    }
  }
  else {
    v_local = 0.0;
  }
  return v_local;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}